

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void jessilib::make_json_string<char32_t,char32_t>
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                *out_string,u8string_view in_string)

{
  size_t sVar1;
  char32_t in_codepoint;
  size_type sVar2;
  size_type sVar3;
  char *in_RCX;
  decode_result dVar4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> bVar5;
  to_chars_result tVar6;
  u8string_view in_string_00;
  u8string_view in_string_01;
  u8string_view in_string_02;
  u8string_view in_string_03;
  u8string_view in_string_04;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_c0;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_b0;
  char *local_a0;
  to_chars_result to_chars_result;
  char *data_end;
  undefined1 auStack_80 [6];
  char data [2];
  char8_t *local_78;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_70;
  char8_t *local_68;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_60;
  char8_t *local_58;
  undefined4 uStack_3c;
  undefined1 local_30 [8];
  decode_result decode;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *out_string_local;
  u8string_view in_string_local;
  
  in_string_local._M_len = (size_t)in_string._M_str;
  out_string_local =
       (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
       in_string._M_len;
  decode.units = (size_t)out_string;
  sVar2 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                    (out_string);
  sVar3 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::size
                    ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&out_string_local);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  reserve(out_string,sVar2 + sVar3 + 2);
  simple_append<char32_t,char32_t>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             decode.units,'\"');
  decode_result::decode_result((decode_result *)local_30);
  while( true ) {
    bVar5._M_str = (char8_t *)in_string_local._M_len;
    bVar5._M_len = (size_t)out_string_local;
    dVar4 = decode_codepoint<char8_t>(bVar5);
    sVar1 = decode.units;
    decode._0_8_ = dVar4.units;
    in_codepoint = dVar4.codepoint;
    local_30._4_4_ = uStack_3c;
    local_30._0_4_ = in_codepoint;
    if (decode._0_8_ == 0) break;
    if (in_codepoint == L'\\') {
      bVar5 = sv("\\\\",2);
      local_60 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 bVar5._M_len;
      local_58 = bVar5._M_str;
      in_string_00._M_str = in_RCX;
      in_string_00._M_len = (size_t)local_58;
      simple_append<char32_t,char32_t>((jessilib *)sVar1,local_60,in_string_00);
    }
    else if (in_codepoint == L'\"') {
      bVar5 = sv("\\\"",2);
      local_70 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 bVar5._M_len;
      local_68 = bVar5._M_str;
      in_string_01._M_str = in_RCX;
      in_string_01._M_len = (size_t)local_68;
      simple_append<char32_t,char32_t>((jessilib *)sVar1,local_70,in_string_01);
    }
    else if ((uint)in_codepoint < 0x20) {
      _auStack_80 = sv("\\u00",4);
      in_string_02._M_str = in_RCX;
      in_string_02._M_len = (size_t)local_78;
      simple_append<char32_t,char32_t>((jessilib *)sVar1,_auStack_80,in_string_02);
      to_chars_result._8_8_ = auStack_80;
      tVar6 = std::to_chars((char *)((long)&data_end + 6),(char *)to_chars_result._8_8_,
                            local_30._0_4_,0x10);
      sVar1 = decode.units;
      local_a0 = tVar6.ptr;
      to_chars_result.ptr._0_4_ = tVar6.ec;
      in_RCX = (char *)((long)&data_end + 6);
      if (local_a0 == in_RCX) {
        local_b0 = sv("00",2);
        in_string_03._M_str = in_RCX;
        in_string_03._M_len = (size_t)local_b0._M_str;
        simple_append<char32_t,char32_t>
                  ((jessilib *)sVar1,
                   (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   local_b0._M_len,in_string_03);
      }
      else if (local_a0 == (char *)to_chars_result._8_8_) {
        std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view
                  (&local_c0,(char8_t *)((long)&data_end + 6),2);
        in_string_04._M_str = in_RCX;
        in_string_04._M_len = (size_t)local_c0._M_str;
        simple_append<char32_t,char32_t>
                  ((jessilib *)sVar1,
                   (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   local_c0._M_len,in_string_04);
      }
      else {
        simple_append<char32_t,char32_t>
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   decode.units,'0');
        simple_append<char32_t,char32_t>
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   decode.units,data_end._6_1_);
      }
    }
    else {
      encode_codepoint<char32_t>
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 decode.units,in_codepoint);
    }
    std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::remove_prefix
              ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&out_string_local,
               decode._0_8_);
  }
  simple_append<char32_t,char32_t>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             decode.units,'\"');
  return;
}

Assistant:

void make_json_string(std::basic_string<ResultCharT>& out_string, std::u8string_view in_string) {
	using namespace std::literals;
	out_string.reserve(out_string.size() + in_string.size() + 2);
	simple_append<CharT, ResultCharT>(out_string, '\"');

	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		if (decode.codepoint == U'\\') { // backslash
			simple_append<CharT, ResultCharT>(out_string, u8"\\\\"sv);
		}
		else if (decode.codepoint == U'\"') { // quotation
			simple_append<CharT, ResultCharT>(out_string, u8"\\\""sv);
		}
		else if (decode.codepoint < 0x20) { // control characters
			simple_append<CharT, ResultCharT>(out_string, u8"\\u00"sv);

			// overwrite last 2 zeroes with correct hexadecimal sequence
			char data[2]; // Will only ever use 2 chars
			char* data_end = data + sizeof(data);
			auto to_chars_result = std::to_chars(data, data_end, static_cast<uint32_t>(decode.codepoint), 16);
			if (to_chars_result.ptr == data) {
				// No bytes written
				simple_append<CharT, ResultCharT>(out_string, u8"00"sv);
			}
			else if (to_chars_result.ptr != data_end) {
				// 1 byte written
				simple_append<CharT, ResultCharT>(out_string, '0');
				simple_append<CharT, ResultCharT>(out_string, data[0]);
			}
			else {
				// 2 bytes written
				simple_append<CharT, ResultCharT>(out_string, std::u8string_view{ reinterpret_cast<char8_t*>(data), sizeof(data) });
			}
		}
		else {
			if constexpr (sizeof(CharT) == sizeof(char8_t) && sizeof(CharT) == sizeof(ResultCharT)) {
				// Valid UTF-8 sequence; copy it over
				out_string.append(reinterpret_cast<const ResultCharT*>(in_string.data()), decode.units);
			}
			else if constexpr (sizeof(CharT) == sizeof(ResultCharT)){
				// Valid UTF-8 codepoint; append it
				encode_codepoint(out_string, decode.codepoint);
			}
			else {
				// Valid UTF-8 codepoint; encode & append it
				encode_buffer_type<CharT> buffer;
				size_t units_written = encode_codepoint(buffer, decode.codepoint);
				out_string.append(reinterpret_cast<ResultCharT*>(buffer), units_written * sizeof(CharT));
			}
		}

		in_string.remove_prefix(decode.units);
	}

	simple_append<CharT, ResultCharT>(out_string, '\"');
}